

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool convertToEnum(QMetaType fromType,void *from,QMetaType toType,void *to)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar7;
  qlonglong value;
  QByteArray local_68;
  QMetaEnum local_48;
  _Storage<unsigned_long_long,_true> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (fromType.d_ptr == (QMetaTypeInterface *)0x0) {
    local_38._M_value = 0xffffffffffffffff;
  }
  else {
    iVar4 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar4 == 0) {
      iVar4 = QMetaType::registerHelper(fromType.d_ptr);
    }
    local_38._M_value = 0xffffffffffffffff;
    if (iVar4 == 4) {
      local_38 = *from;
      goto LAB_00290f17;
    }
    if ((iVar4 == 0xc) || (iVar4 == 10)) {
      local_48 = metaEnumFromType(toType);
      pcVar5 = QMetaEnum::name(&local_48);
      if (pcVar5 != (char *)0x0) {
        local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        if (iVar4 == 10) {
          QString::toUtf8_helper(&local_68,(QString *)from);
        }
        else {
          local_68.d.d = *from;
          local_68.d.ptr = *(char **)((long)from + 8);
          local_68.d.size = *(undefined8 *)((long)from + 0x10);
          if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
        }
        pcVar5 = local_68.d.ptr;
        if (local_68.d.ptr == (char *)0x0) {
          pcVar5 = &QByteArray::_empty;
        }
        oVar7 = QMetaEnum::keysToValue64(&local_48,pcVar5);
        if (((undefined1  [16])
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          local_38._M_value =
               oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long_long>._M_payload;
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (((undefined1  [16])
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) goto LAB_00290f17;
      }
    }
  }
  bVar2 = QMetaType::convert(fromType,from,
                             (QMetaType)&QtPrivate::QMetaTypeInterfaceWrapper<long_long>::metaType,
                             &local_38);
  if (!bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return false;
    }
    __stack_chk_fail();
  }
LAB_00290f17:
  if (toType.d_ptr == (QMetaTypeInterface *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(toType.d_ptr)->size;
  }
  lVar1 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  uVar3 = (*(code *)((long)&DAT_004d1560 + (long)(int)(&DAT_004d1560)[lVar1]))();
  return (bool)uVar3;
}

Assistant:

static bool convertToEnum(QMetaType fromType, const void *from, QMetaType toType, void *to)
{
    int fromTypeId = fromType.id();
    qlonglong value = -1;
    bool ok = false;
#ifndef QT_NO_QOBJECT
    if (fromTypeId == QMetaType::QString || fromTypeId == QMetaType::QByteArray) {
        QMetaEnum en = metaEnumFromType(toType);
        if (en.isValid()) {
            QByteArray keys = (fromTypeId == QMetaType::QString)
                    ? static_cast<const QString *>(from)->toUtf8()
                    : *static_cast<const QByteArray *>(from);
            if (auto v = en.keysToValue64(keys.constData())) {
                ok = true;
                value = *v;
            }
        }
    }
#endif
    if (!ok) {
        if (fromTypeId == QMetaType::LongLong) {
            value = *static_cast<const qlonglong *>(from);
            ok = true;
        } else {
            ok = QMetaType::convert(fromType, from, QMetaType::fromType<qlonglong>(), &value);
        }
    }

    if (!ok)
        return false;

    switch (toType.sizeOf()) {
    case 1:
        *static_cast<signed char *>(to) = value;
        return true;
    case 2:
        *static_cast<qint16 *>(to) = value;
        return true;
    case 4:
        *static_cast<qint32 *>(to) = value;
        return true;
    case 8:
        *static_cast<qint64 *>(to) = value;
        return true;
    default:
        Q_UNREACHABLE_RETURN(false);
    }
}